

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cTextureGatherTests.cpp
# Opt level: O0

string * __thiscall
glcts::(anonymous_namespace)::TriangleDraw::FragmentShader_abi_cxx11_
          (string *__return_storage_ptr__,void *this)

{
  allocator<char> local_19;
  void *local_18;
  TriangleDraw *this_local;
  
  local_18 = this;
  this_local = (TriangleDraw *)__return_storage_ptr__;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)__return_storage_ptr__,
             "#version 310 es                                   \nprecision highp float;                            \nflat in mediump vec2 texcoords;                   \nout highp uvec4 FragColor;                        \nuniform mediump sampler2D tex;                    \nvoid main() {                                     \n   vec4 data = textureGather(tex, texcoords, 2);  \n   FragColor = floatBitsToUint(data);             \n}\n"
             ,&local_19);
  std::allocator<char>::~allocator(&local_19);
  return __return_storage_ptr__;
}

Assistant:

virtual std::string FragmentShader()
	{
		return "#version 310 es                                   \n"
			   "precision highp float;                            \n"
			   "flat in mediump vec2 texcoords;                   \n"
			   "out highp uvec4 FragColor;                        \n"
			   "uniform mediump sampler2D tex;                    \n"
			   "void main() {                                     \n"
			   "   vec4 data = textureGather(tex, texcoords, 2);  \n"
			   "   FragColor = floatBitsToUint(data);             \n"
			   "}\n";
	}